

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int op_http_conn_read(OpusHTTPConn *_conn,char *_buf,int _buf_size,int _blocking)

{
  bool bVar1;
  int ret_code;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int unaff_R12D;
  SSL *ssl;
  pollfd fd;
  pollfd local_50;
  OpusHTTPConn *local_48;
  char *local_40;
  SSL *local_38;
  
  local_50.fd = _conn->fd;
  ssl = (SSL *)_conn->ssl_conn;
  iVar6 = 0;
  iVar7 = 0;
  local_48 = _conn;
  local_40 = _buf;
  local_38 = ssl;
  do {
    if (ssl == (SSL *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      sVar4 = recv(local_50.fd,local_40 + iVar7,(long)(_buf_size - iVar7),0);
      if (sVar4 < 1) {
        if (0 < iVar7 || sVar4 == 0) {
          cVar5 = '\x02';
          goto LAB_0010eb78;
        }
        cVar5 = '\0';
        if (*piVar3 == 0xb) {
          local_50.events = 1;
          bVar1 = true;
        }
        else {
          unaff_R12D = -0x80;
          cVar5 = '\x01';
          bVar1 = false;
        }
      }
      else {
        iVar7 = iVar7 + (int)sVar4;
        iVar6 = iVar6 + (int)sVar4;
        cVar5 = '\x03';
LAB_0010eb78:
        bVar1 = false;
      }
      ssl = local_38;
      if (bVar1) goto LAB_0010ec05;
    }
    else {
      ret_code = SSL_read(ssl,local_40 + iVar7,_buf_size - iVar7);
      if (ret_code < 1) {
        if (0 < iVar7) {
          cVar5 = '\x02';
          goto LAB_0010ebff;
        }
        iVar2 = SSL_get_error(ssl,ret_code);
        if (ret_code == 0) {
          unaff_R12D = (uint)(iVar2 == 6) * 0x80 + -0x80;
LAB_0010ebfa:
          cVar5 = '\x01';
          goto LAB_0010ebff;
        }
        if (iVar2 == 3) {
          local_50.events = 4;
        }
        else {
          if (iVar2 != 2) {
            unaff_R12D = -0x80;
            goto LAB_0010ebfa;
          }
          local_50.events = 1;
        }
        cVar5 = '\0';
        bVar1 = true;
      }
      else {
        iVar7 = iVar7 + ret_code;
        iVar6 = iVar6 + ret_code;
        cVar5 = '\x03';
LAB_0010ebff:
        bVar1 = false;
      }
      if (bVar1) {
LAB_0010ec05:
        local_48->read_bytes = local_48->read_bytes + (long)iVar6;
        op_http_conn_read_rate_update(local_48);
        iVar6 = poll(&local_50,1,30000);
        cVar5 = iVar6 < 1;
        if (iVar6 < 1) {
          unaff_R12D = -0x80;
        }
        iVar6 = 0;
      }
    }
    if ((cVar5 != '\0') && (cVar5 != '\x03')) {
      if (cVar5 != '\x02') {
        return unaff_R12D;
      }
      goto LAB_0010ec55;
    }
    if (_buf_size <= iVar7) {
LAB_0010ec55:
      local_48->read_bytes = local_48->read_bytes + (long)iVar6;
      return iVar7;
    }
  } while( true );
}

Assistant:

static int op_http_conn_read(OpusHTTPConn *_conn,
 char *_buf,int _buf_size,int _blocking){
  struct pollfd  fd;
  SSL           *ssl_conn;
  int            nread;
  int            nread_unblocked;
  fd.fd=_conn->fd;
  ssl_conn=_conn->ssl_conn;
  nread=nread_unblocked=0;
  /*RFC 2818 says "client implementations MUST treat any premature closes as
     errors and the data received as potentially truncated," so we make very
     sure to report read errors upwards.*/
  do{
    int err;
    if(ssl_conn!=NULL){
      int ret;
      ret=SSL_read(ssl_conn,_buf+nread,_buf_size-nread);
      OP_ASSERT(ret<=_buf_size-nread);
      if(ret>0){
        /*Read some data.
          Keep going to see if there's more.*/
        nread+=ret;
        nread_unblocked+=ret;
        continue;
      }
      /*If we already read some data, return it right now.*/
      if(nread>0)break;
      err=SSL_get_error(ssl_conn,ret);
      if(ret==0){
        /*Connection close.
          Check for a clean shutdown to prevent truncation attacks.
          This check always succeeds for SSLv2, as it has no "close notify"
           message and thus can't verify an orderly shutdown.*/
        return err==SSL_ERROR_ZERO_RETURN?0:OP_EREAD;
      }
      if(err==SSL_ERROR_WANT_READ)fd.events=POLLIN;
      /*Yes, renegotiations can cause SSL_read() to block for writing.*/
      else if(err==SSL_ERROR_WANT_WRITE)fd.events=POLLOUT;
      /*Some other error.*/
      else return OP_EREAD;
    }
    else{
      ssize_t ret;
      op_reset_errno();
      ret=recv(fd.fd,_buf+nread,_buf_size-nread,0);
      OP_ASSERT(ret<=_buf_size-nread);
      if(ret>0){
        /*Read some data.
          Keep going to see if there's more.*/
        OP_ASSERT(ret<=_buf_size-nread);
        nread+=(int)ret;
        nread_unblocked+=(int)ret;
        continue;
      }
      /*If we already read some data or the connection was closed, return
         right now.*/
      if(ret==0||nread>0)break;
      err=op_errno();
      if(err!=EAGAIN&&err!=EWOULDBLOCK)return OP_EREAD;
      fd.events=POLLIN;
    }
    _conn->read_bytes+=nread_unblocked;
    op_http_conn_read_rate_update(_conn);
    nread_unblocked=0;
    if(!_blocking)break;
    /*Need to wait to get any data at all.*/
    if(poll(&fd,1,OP_POLL_TIMEOUT_MS)<=0)return OP_EREAD;
  }
  while(nread<_buf_size);
  _conn->read_bytes+=nread_unblocked;
  return nread;
}